

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::LRUCache::~LRUCache(LRUCache *this)

{
  LRUHandle *pLVar1;
  LRUHandle *next;
  LRUHandle *e;
  LRUCache *this_local;
  
  next = (this->lru_).next;
  while( true ) {
    if (next == &this->lru_) {
      HandleTable::~HandleTable(&this->table_);
      port::Mutex::~Mutex(&this->mutex_);
      return;
    }
    pLVar1 = next->next;
    if (next->refs != 1) break;
    Unref(this,next);
    next = pLVar1;
  }
  __assert_fail("e->refs == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/util/cache.cc"
                ,0xc4,"leveldb::(anonymous namespace)::LRUCache::~LRUCache()");
}

Assistant:

LRUCache::~LRUCache() {
            for (LRUHandle *e = lru_.next; e != &lru_;) {
                LRUHandle *next = e->next;
                assert(e->refs == 1);  // Error if caller has an unreleased handle
                Unref(e);
                e = next;
            }
        }